

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

int __thiscall httplib::Server::bind_internal(Server *this,char *host,int port,int socket_flags)

{
  int iVar1;
  socket_t sVar2;
  uint uVar3;
  socklen_t addr_len;
  sockaddr_storage addr;
  socklen_t local_dc;
  _Any_data local_d8;
  code *local_c8;
  undefined8 uStack_c0;
  _Any_data local_b8;
  code *local_a8;
  undefined8 local_a0;
  
  iVar1 = (*this->_vptr_Server[2])();
  uVar3 = 0xffffffff;
  if ((char)iVar1 != '\0') {
    std::function<void_(int)>::function((function<void_(int)> *)&local_d8,&this->socket_options_);
    local_b8._M_unused._M_object = (void *)0x0;
    local_b8._8_8_ = 0;
    local_a8 = (code *)0x0;
    local_a0 = uStack_c0;
    if (local_c8 != (code *)0x0) {
      local_b8._M_unused._M_object = local_d8._M_unused._M_object;
      local_b8._8_8_ = local_d8._8_8_;
      local_a8 = local_c8;
      local_c8 = (code *)0x0;
      uStack_c0 = 0;
    }
    sVar2 = detail::
            create_socket<httplib::Server::create_server_socket(char_const*,int,int,std::function<void(int)>)const::_lambda(int,addrinfo&)_1_>
                      (host,"",port,this->address_family_,socket_flags,this->tcp_nodelay_,&local_b8)
    ;
    if (local_a8 != (code *)0x0) {
      (*local_a8)(&local_b8,&local_b8,__destroy_functor);
    }
    LOCK();
    (this->svr_sock_).super___atomic_base<int>._M_i = sVar2;
    UNLOCK();
    if (local_c8 != (code *)0x0) {
      (*local_c8)(&local_d8,&local_d8,__destroy_functor);
    }
    if (((this->svr_sock_).super___atomic_base<int>._M_i != -1) && (uVar3 = port, port == 0)) {
      local_dc = 0x80;
      iVar1 = getsockname((this->svr_sock_).super___atomic_base<int>._M_i,(sockaddr *)&local_b8,
                          &local_dc);
      uVar3 = 0xffffffff;
      if ((iVar1 != -1) && ((local_b8._0_2_ == 10 || (local_b8._0_2_ == 2)))) {
        uVar3 = (uint)(ushort)(local_b8._2_2_ << 8 | (ushort)local_b8._2_2_ >> 8);
      }
    }
  }
  return uVar3;
}

Assistant:

inline int Server::bind_internal(const char *host, int port, int socket_flags) {
  if (!is_valid()) { return -1; }

  svr_sock_ = create_server_socket(host, port, socket_flags, socket_options_);
  if (svr_sock_ == INVALID_SOCKET) { return -1; }

  if (port == 0) {
    struct sockaddr_storage addr;
    socklen_t addr_len = sizeof(addr);
    if (getsockname(svr_sock_, reinterpret_cast<struct sockaddr *>(&addr),
                    &addr_len) == -1) {
      return -1;
    }
    if (addr.ss_family == AF_INET) {
      return ntohs(reinterpret_cast<struct sockaddr_in *>(&addr)->sin_port);
    } else if (addr.ss_family == AF_INET6) {
      return ntohs(reinterpret_cast<struct sockaddr_in6 *>(&addr)->sin6_port);
    } else {
      return -1;
    }
  } else {
    return port;
  }
}